

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O2

void __thiscall InputReader::parseFile(InputReader *this,istream *fin,InputParser *parser)

{
  InputError *this_00;
  InputReader *this_01;
  string local_a8;
  undefined1 local_88 [8];
  string line;
  string token;
  allocator local_31;
  
  local_88 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  line.field_2._8_8_ = &token._M_string_length;
  token._M_dataplus._M_p = (pointer)0x0;
  token._M_string_length._0_1_ = 0;
  std::ios::clear((int)*(undefined8 *)(*(long *)fin + -0x18) + (int)fin);
  std::istream::seekg(fin,0,0);
  this->section = -1;
  do {
    if (9 < this->errcount) {
LAB_0013281d:
      this_00 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_a8,"",&local_31);
      InputError::InputError(this_00,0,&local_a8);
      __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
    }
    this_01 = (InputReader *)fin;
    std::getline<char,std::char_traits<char>,std::allocator<char>>(fin,(string *)local_88,'\n');
    if (((*(uint *)(fin + *(long *)(*(long *)fin + -0x18) + 0x20) & 5) != 0 &
        (byte)((*(uint *)(fin + *(long *)(*(long *)fin + -0x18) + 0x20) & 2) >> 1)) != 0) {
      if (this->errcount < 1) {
        std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_88);
        return;
      }
      goto LAB_0013281d;
    }
    trimLine(this_01,(string *)local_88);
    std::ios::clear((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
    std::__cxx11::stringbuf::str((string *)&this->field_0x10);
    std::operator>>((istream *)this,(string *)(line.field_2._M_local_buf + 8));
    if ((((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) == 0) &&
       (*(char *)line.field_2._8_8_ != '\0')) {
      if (*(char *)line.field_2._8_8_ == '[') {
        findSection(this,(string *)(line.field_2._M_local_buf + 8));
      }
      else {
        (*parser->_vptr_InputParser[2])(parser,(string *)local_88,(ulong)(uint)this->section);
      }
    }
  } while( true );
}

Assistant:

void InputReader::parseFile(istream& fin, InputParser& parser)
{
    string line;
    string token;

    // ... reset input file

    fin.clear();
    fin.seekg(0);
    section = -1;

    // ... read each line from input file

    for (;;)
    {
        if ( errcount >= MAXERRS ) break;
        getline(fin, line, '\n');
        if (fin.fail())
        {
            if ( fin.eof() ) break;    // end of file reached - normal termination
        }

        // ... remove any comment from input line

        trimLine(line);

        // ... read 1st token from input line

        sin.clear();                   // clear string stream status flags
        sin.str(line);                 // assign input line to string stream
        sin >> token;                  // read 1st token from string stream

        // ... skip blank lines

        if ( sin.fail() || token[0] == '\0' ) continue;
        try
        {
            // ... see if at start of new input section

            if ( token[0] == '[' ) findSection(token);

            // ... otherwise parse input line of data

            else parser.parseLine(line, section);
        }
        catch (InputError& e)
        {
            errcount++;
            if ( section >= 0 )
            {
                parser.network->msgLog << e.msg << " at following line of " <<
                    sections[section] << "] section:\n";
            }
            else
            {
                parser.network->msgLog << e.msg << " at following line of file:\n";
            }
            parser.network->msgLog << line << "\n";
        }
        catch (...)
        {
            errcount++;
        }
    }

    // ... throw general input file exception if errors were found

    if ( errcount > 0 ) throw InputError(InputError::ERRORS_IN_INPUT_DATA, "");
}